

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::add_layer(ANN *this,uint n_layer,initializer_list<unsigned_int> *n_perceptrons)

{
  const_iterator puVar1;
  undefined1 local_80 [8];
  Layer layer;
  uint i;
  initializer_list<unsigned_int> *n_perceptrons_local;
  uint n_layer_local;
  ANN *this_local;
  
  for (layer.m_biases.m_shape.field_0.m_dims[1] = 0;
      layer.m_biases.m_shape.field_0.m_dims[1] < n_layer;
      layer.m_biases.m_shape.field_0.m_dims[1] = layer.m_biases.m_shape.field_0.m_dims[1] + 1) {
    Layer::Layer((Layer *)local_80);
    puVar1 = std::initializer_list<unsigned_int>::begin(n_perceptrons);
    Layer::add_perceptron((Layer *)local_80,puVar1[layer.m_biases.m_shape.field_0.m_dims[1]]);
    std::vector<Layer,_std::allocator<Layer>_>::push_back(&this->m_layers,(value_type *)local_80);
    Layer::~Layer((Layer *)local_80);
  }
  return;
}

Assistant:

void ANN::add_layer(uint n_layer, const std::initializer_list<uint>& n_perceptrons){
    for(uint i=0;i<n_layer;++i){
    Layer layer;
    layer.add_perceptron(*(n_perceptrons.begin()+i));
    m_layers.push_back(layer);
    }
}